

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::LineStripAdjacencyGen
          (DrawIndirectBase *this,uint param_1,uint drawSizeY,CColorArray *output)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar1;
  int iVar2;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<float,_4> local_4c;
  float local_3c;
  uint local_38;
  float offsetY;
  uint i;
  float local_24;
  CColorArray *pCStack_20;
  float rasterSize;
  CColorArray *output_local;
  uint drawSizeY_local;
  uint param_1_local;
  DrawIndirectBase *this_local;
  
  pCStack_20 = output;
  output_local._0_4_ = drawSizeY;
  output_local._4_4_ = param_1;
  _drawSizeY_local = this;
  iVar2 = getWindowHeight(this);
  pvVar1 = pCStack_20;
  local_24 = 2.0 / (float)iVar2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&offsetY,-1.5,local_24 / 2.0,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            (pvVar1,(value_type *)&offsetY);
  for (local_38 = 0; pvVar1 = pCStack_20, local_38 < (uint)output_local; local_38 = local_38 + 1) {
    local_3c = LinesOffsetY(this,local_38,local_24);
    pvVar1 = pCStack_20;
    tcu::Vector<float,_4>::Vector(&local_4c,-1.0,local_3c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_4c);
    pvVar1 = pCStack_20;
    tcu::Vector<float,_4>::Vector(&local_5c,-1.0,local_3c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_5c);
    pvVar1 = pCStack_20;
    tcu::Vector<float,_4>::Vector(&local_6c,1.0,local_3c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_6c);
    pvVar1 = pCStack_20;
    tcu::Vector<float,_4>::Vector(&local_7c,1.0,local_3c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_7c);
  }
  tcu::Vector<float,_4>::Vector(&local_8c,1.5,1.0 - local_24 / 2.0,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            (pvVar1,&local_8c);
  return;
}

Assistant:

void LineStripAdjacencyGen(unsigned int, unsigned int drawSizeY, CColorArray& output)
	{
		float rasterSize = 2.0f / static_cast<float>(getWindowHeight());
		output.push_back(tcu::Vec4(-1.5f, rasterSize / 2, 0.0f, 1.0f));
		for (unsigned int i = 0; i < drawSizeY; ++i)
		{
			float offsetY = LinesOffsetY(i, rasterSize);
			output.push_back(tcu::Vec4(-1.0f, offsetY, 0.0f, 1.0f));
			output.push_back(tcu::Vec4(-1.0f, offsetY, 0.0f, 1.0f));
			output.push_back(tcu::Vec4(1.0f, offsetY, 0.0f, 1.0f));
			output.push_back(tcu::Vec4(1.0f, offsetY, 0.0f, 1.0f));
		}
		output.push_back(tcu::Vec4(1.5f, 1.0f - rasterSize / 2, 0.0f, 1.0f));
	}